

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QCss::StyleSheet>::relocate
          (QArrayDataPointer<QCss::StyleSheet> *this,qsizetype offset,StyleSheet **data)

{
  StyleSheet *d_first;
  StyleSheet *pSVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QCss::StyleSheet,long_long>(this->ptr,this->size,d_first);
  if (data != (StyleSheet **)0x0) {
    pSVar1 = *data;
    if ((this->ptr <= pSVar1) && (pSVar1 < this->ptr + this->size)) {
      *data = pSVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }